

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_get_traffic_keys(ptls_t *tls,int is_enc,uint8_t *key,uint8_t *iv,uint64_t *seq)

{
  ptls_aead_algorithm_t *aead;
  ptls_hash_algorithm_t *hash;
  ptls_iovec_t hash_value;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_60;
  int ret;
  st_ptls_traffic_protection_t *ctx;
  uint64_t *seq_local;
  uint8_t *iv_local;
  uint8_t *key_local;
  int is_enc_local;
  ptls_t *tls_local;
  
  if (is_enc == 0) {
    local_60 = &tls->traffic_protection;
  }
  else {
    local_60 = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  }
  aead = tls->cipher_suite->aead;
  hash = tls->cipher_suite->hash;
  hash_value = ptls_iovec_init((void *)0x0,0);
  tls_local._4_4_ = get_traffic_keys(aead,hash,key,iv,local_60,hash_value,(char *)0x0);
  if (tls_local._4_4_ == 0) {
    *seq = (local_60->dec).seq;
    tls_local._4_4_ = 0;
  }
  return tls_local._4_4_;
}

Assistant:

int ptls_get_traffic_keys(ptls_t *tls, int is_enc, uint8_t *key, uint8_t *iv, uint64_t *seq)
{
    struct st_ptls_traffic_protection_t *ctx = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;
    int ret;

    if ((ret = get_traffic_keys(tls->cipher_suite->aead, tls->cipher_suite->hash, key, iv, ctx->secret, ptls_iovec_init(NULL, 0),
                                NULL)) != 0)
        return ret;
    *seq = ctx->seq;
    return 0;
}